

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern.c
# Opt level: O0

int xmlStreamCtxtAddState(xmlStreamCtxtPtr comp,int idx,int level)

{
  int iVar1;
  int *piVar2;
  int *cur;
  int i;
  int level_local;
  int idx_local;
  xmlStreamCtxtPtr comp_local;
  
  for (cur._4_4_ = 0; cur._4_4_ < comp->nbState; cur._4_4_ = cur._4_4_ + 1) {
    if (comp->states[cur._4_4_ << 1] < 0) {
      comp->states[cur._4_4_ << 1] = idx;
      comp->states[cur._4_4_ * 2 + 1] = level;
      return cur._4_4_;
    }
  }
  if (comp->maxState <= comp->nbState) {
    piVar2 = (int *)(*xmlRealloc)(comp->states,(long)(comp->maxState << 2) << 2);
    if (piVar2 == (int *)0x0) {
      return -1;
    }
    comp->states = piVar2;
    comp->maxState = comp->maxState << 1;
  }
  comp->states[comp->nbState << 1] = idx;
  iVar1 = comp->nbState;
  comp->nbState = iVar1 + 1;
  comp->states[iVar1 * 2 + 1] = level;
  return comp->nbState + -1;
}

Assistant:

static int
xmlStreamCtxtAddState(xmlStreamCtxtPtr comp, int idx, int level) {
    int i;
    for (i = 0;i < comp->nbState;i++) {
        if (comp->states[2 * i] < 0) {
	    comp->states[2 * i] = idx;
	    comp->states[2 * i + 1] = level;
	    return(i);
	}
    }
    if (comp->nbState >= comp->maxState) {
        int *cur;

	cur = (int *) xmlRealloc(comp->states,
				 comp->maxState * 4 * sizeof(int));
	if (cur == NULL) {
	    ERROR(NULL, NULL, NULL,
		  "xmlNewStreamCtxt: malloc failed\n");
	    return(-1);
	}
	comp->states = cur;
        comp->maxState *= 2;
    }
    comp->states[2 * comp->nbState] = idx;
    comp->states[2 * comp->nbState++ + 1] = level;
    return(comp->nbState - 1);
}